

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O3

void __thiscall TCLAP::StdOutput::_shortUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  long lVar1;
  Arg *pAVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long *plVar8;
  pointer ppAVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  string s;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  string progName;
  XorHandler xorHandler;
  string local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> local_f0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_b8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80;
  int local_78;
  undefined4 uStack_74;
  undefined1 local_70 [16];
  StdOutput *local_60;
  ostream *local_58;
  ulong local_50;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_48;
  
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xb])(_cmd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (&local_f0,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  local_80 = local_70;
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,lVar1,((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar1);
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xc])(_cmd);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_48,
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)CONCAT44(extraout_var_01,iVar4));
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_b8,&local_48);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_80,local_80 + CONCAT44(uStack_74,local_78));
  local_60 = this;
  local_58 = os;
  std::__cxx11::string::append((char *)&local_130);
  if (local_b8.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b8.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      std::__cxx11::string::append((char *)&local_130);
      local_50 = uVar10;
      for (ppAVar9 = local_b8.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                     super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar9 !=
          local_b8.
          super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar10].
          super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppAVar9 = ppAVar9 + 1) {
        pAVar2 = *ppAVar9;
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"val","");
        (*pAVar2->_vptr_Arg[8])(local_a0,pAVar2,(string *)local_d8);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_a0);
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_100 = *plVar8;
          lStack_f8 = plVar5[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar8;
          local_110 = (long *)*plVar5;
        }
        local_108 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0]);
        }
      }
      local_130._M_dataplus._M_p[local_130._M_string_length - 1] = '}';
      uVar10 = local_50 + 1;
      uVar6 = ((long)local_b8.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
  }
  if (local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_f0) {
    p_Var11 = local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node
              .super__List_node_base._M_next;
    do {
      pAVar2 = (Arg *)p_Var11[1]._M_next;
      if ((long)local_48.
                super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0010de1b:
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"val","");
        (*(code *)((_List_node_base *)pAVar2->_vptr_Arg)[4]._M_next)
                  (local_a0,pAVar2,(string *)local_d8);
        puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x117693)
        ;
        plVar5 = puVar7 + 2;
        if ((long *)*puVar7 == plVar5) {
          local_100 = *plVar5;
          lStack_f8 = puVar7[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar5;
          local_110 = (long *)*puVar7;
        }
        local_108 = puVar7[1];
        *puVar7 = plVar5;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0]);
        }
      }
      else {
        uVar10 = ((long)local_48.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar3 = true;
        uVar6 = 0;
        do {
          for (ppAVar9 = local_48.
                         super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6].
                         super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              ppAVar9 !=
              local_48.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6].
              super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppAVar9 = ppAVar9 + 1) {
            if (*ppAVar9 == pAVar2) goto LAB_0010de11;
          }
          uVar6 = uVar6 + 1;
          bVar3 = uVar6 <= uVar10 && uVar10 - uVar6 != 0;
        } while (uVar6 != uVar10 + (uVar10 == 0));
LAB_0010de11:
        if (!bVar3) goto LAB_0010de1b;
      }
      p_Var11 = p_Var11->_M_next;
    } while (p_Var11 != (_List_node_base *)&local_f0);
  }
  iVar4 = 0x23;
  if (local_78 < 0x23) {
    iVar4 = local_78;
  }
  spacePrint(local_60,local_58,&local_130,0x4b,3,iVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_48);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  while (local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_f0) {
    p_Var11 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
               &(local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                    _M_node.super__List_node_base._M_next);
    local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var11;
  }
  return;
}

Assistant:

inline void 
StdOutput::_shortUsage( CmdLineInterface& _cmd, 
						std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string progName = _cmd.getProgramName();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	std::string s = progName + " ";

	// first the xor
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			s += " {";
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); it++ )
				s += (*it)->shortID() + "|";

			s[s.length()-1] = '}';
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			s += " " + (*it)->shortID();

	// if the program name is too long, then adjust the second line offset 
	int secondLineOffset = static_cast<int>(progName.length()) + 2;
	if ( secondLineOffset > 75/2 )
		secondLineOffset = static_cast<int>(75/2);

	spacePrint( os, s, 75, 3, secondLineOffset );
}